

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btQuickprof.cpp
# Opt level: O2

void __thiscall CProfileNode::Reset(CProfileNode *this)

{
  do {
    this->TotalCalls = 0;
    this->TotalTime = 0.0;
    if (this->Child != (CProfileNode *)0x0) {
      Reset(this->Child);
    }
    this = this->Sibling;
  } while (this != (CProfileNode *)0x0);
  return;
}

Assistant:

void	CProfileNode::Reset( void )
{
	TotalCalls = 0;
	TotalTime = 0.0f;


	if ( Child ) {
		Child->Reset();
	}
	if ( Sibling ) {
		Sibling->Reset();
	}
}